

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::texsubimage2d(NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_50;
  deUint32 texture;
  
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,0x20,0x20,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_INVALID_ENUM is generated if target is invalid.","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0,0,0,0,4,4,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "GL_INVALID_ENUM is generated if format is not an accepted format constant.","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,0,4,4,0x1401,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"GL_INVALID_ENUM is generated if type is not a type constant.","");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x1907,0,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "GL_INVALID_OPERATION is generated if the combination of internalFormat of the previously specified texture array, format and type is not valid."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x1908,0x8363,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x1907,0x8033,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x1907,0x8034,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x1907,0x8034,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x8d99,0x1405,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexSubImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0,0,4,4,0x1907,0x1406,(void *)0x0);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void texsubimage2d (NegativeTestContext& ctx)
{
	deUint32			texture = 0x1234;
	ctx.glGenTextures		(1, &texture);
	ctx.glBindTexture		(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D		(GL_TEXTURE_2D, 0, GL_RGBA, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError			(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is invalid.");
	ctx.glTexSubImage2D(0, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if format is not an accepted format constant.");
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 0, 4, 4, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not a type constant.");
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGB, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the combination of internalFormat of the previously specified texture array, format and type is not valid.");
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_SHORT_5_6_5, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGB, GL_UNSIGNED_SHORT_4_4_4_4, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGB, GL_UNSIGNED_SHORT_5_5_5_1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGB, GL_UNSIGNED_SHORT_5_5_5_1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA_INTEGER, GL_UNSIGNED_INT, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGB, GL_FLOAT, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.glDeleteTextures	(1, &texture);
}